

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.c
# Opt level: O3

int libssh2_session_flag(LIBSSH2_SESSION *session,int flag,int value)

{
  long lVar1;
  
  if (flag == 1) {
    lVar1 = 0x6c;
  }
  else {
    if (flag != 2) {
      return -0x22;
    }
    lVar1 = 0x70;
  }
  *(int *)((long)&session->abstract + lVar1) = value;
  return 0;
}

Assistant:

LIBSSH2_API int
libssh2_session_flag(LIBSSH2_SESSION * session, int flag, int value)
{
    switch(flag) {
    case LIBSSH2_FLAG_SIGPIPE:
        session->flag.sigpipe = value;
        break;
    case LIBSSH2_FLAG_COMPRESS:
        session->flag.compress = value;
        break;
    default:
        /* unknown flag */
        return LIBSSH2_ERROR_INVAL;
    }

    return LIBSSH2_ERROR_NONE;
}